

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

Origin ON_Font::FontOriginFromUnsigned(uint unsigned_font_origin)

{
  Origin local_9;
  uint unsigned_font_origin_local;
  
  switch(unsigned_font_origin) {
  case 0:
    local_9 = Unset;
    break;
  case 1:
    local_9 = Unknown;
    break;
  case 2:
    local_9 = WindowsFont;
    break;
  case 3:
    local_9 = AppleFont;
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
               ,0x303f,"","Invalid unsigned_font_origin value.");
    local_9 = Unset;
  }
  return local_9;
}

Assistant:

ON_Font::Origin ON_Font::FontOriginFromUnsigned(
  unsigned int unsigned_font_origin
)
{
  switch (unsigned_font_origin)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Origin::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Origin::Unknown);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Origin::WindowsFont);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Origin::AppleFont);
  };

  ON_ERROR("Invalid unsigned_font_origin value.");
  return ON_Font::Origin::Unset;
}